

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void fmt::v5::internal::
     value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
     ::format_custom_arg<flow::FilePos>
               (void *arg,
               basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
               *ctx)

{
  type tVar1;
  type f;
  formatter<flow::FilePos,char,void> local_11;
  
  basic_parse_context<char,_fmt::v5::internal::error_handler>::advance_to
            ((basic_parse_context<char,_fmt::v5::internal::error_handler> *)ctx,
             (ctx->
             super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
             ).parse_context_.format_str_.data_);
  tVar1 = formatter<flow::FilePos,char,void>::
          format<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                    (&local_11,(FilePos *)arg,ctx);
  (ctx->
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  ).out_.container = tVar1.container;
  return;
}

Assistant:

static void format_custom_arg(const void *arg, Context &ctx) {
    // Get the formatter type through the context to allow different contexts
    // have different extension points, e.g. `formatter<T>` for `format` and
    // `printf_formatter<T>` for `printf`.
    typename Context::template formatter_type<T>::type f;
    auto &&parse_ctx = ctx.parse_context();
    parse_ctx.advance_to(f.parse(parse_ctx));
    ctx.advance_to(f.format(*static_cast<const T*>(arg), ctx));
  }